

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# _PDCLIB_scan.c
# Opt level: O0

int testscanf(char *s,char *format,...)

{
  char in_AL;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined1 local_128 [16];
  undefined8 local_118;
  undefined8 local_110;
  undefined8 local_108;
  undefined8 local_100;
  undefined8 local_f8;
  undefined8 local_e8;
  undefined8 local_d8;
  undefined8 local_c8;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  char *local_78;
  char *rc;
  _PDCLIB_status_t status;
  char *format_local;
  char *s_local;
  
  if (in_AL != '\0') {
    local_f8 = in_XMM0_Qa;
    local_e8 = in_XMM1_Qa;
    local_d8 = in_XMM2_Qa;
    local_c8 = in_XMM3_Qa;
    local_b8 = in_XMM4_Qa;
    local_a8 = in_XMM5_Qa;
    local_98 = in_XMM6_Qa;
    local_88 = in_XMM7_Qa;
  }
  status.base = 0;
  status.flags = 0;
  status.n = 0;
  status.prec = 0;
  status._52_4_ = 0;
  status.arg[0].overflow_arg_area = local_128;
  status.arg[0]._0_8_ = &stack0x00000008;
  status.stream._4_4_ = 0x30;
  status.stream._0_4_ = 0x10;
  local_118 = in_RDX;
  local_110 = in_RCX;
  local_108 = in_R8;
  local_100 = in_R9;
  status.current = (unsigned_long)s;
  status.arg[0].reg_save_area = format;
  local_78 = _PDCLIB_scan(format,(_PDCLIB_status_t *)&rc);
  if ((local_78 != (char *)0x0) && (*local_78 != '\0')) {
    printf("_PDCLIB_scan() did not return end-of-specifier on \'%s\'.\n",status.arg[0].reg_save_area
          );
    TEST_RESULTS = TEST_RESULTS + 1;
  }
  if ((local_78 == (char *)0x0) && (*s != '\0')) {
    printf("_PDCLIB_scan() returned NULL on \'%s\' input.",s);
    TEST_RESULTS = TEST_RESULTS + 1;
  }
  return status.base;
}

Assistant:

static int testscanf( const char * s, const char * format, ... )
{
    struct _PDCLIB_status_t status;
    char const * rc;

    status.n = 0;
    status.i = 0;
    status.s = ( char * )s;
    status.stream = NULL;
    va_start( status.arg, format );

    rc = _PDCLIB_scan( format, &status );

    if ( rc != NULL && rc[0] != '\0' )
    {
        printf( "_PDCLIB_scan() did not return end-of-specifier on '%s'.\n", format );
        ++TEST_RESULTS;
    }

    if ( rc == NULL && s[0] != '\0' )
    {
        printf( "_PDCLIB_scan() returned NULL on '%s' input.", s );
        ++TEST_RESULTS;
    }

    va_end( status.arg );
    return status.n;
}